

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,char *command,string *output,int *retVal,char *dir,int timeout,ostream *ofs
          )

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  cmsysProcess *cp;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  long *plVar7;
  ulong uVar8;
  char **ppcVar9;
  ulong uVar10;
  const_iterator a;
  pointer pbVar11;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *data;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 auStack_248 [8];
  long *local_240;
  long local_230 [2];
  cmCTest *local_220;
  string *local_218;
  int local_20c;
  char **local_208;
  iterator iStack_200;
  char **local_1f8;
  int *local_1e8;
  char *local_1e0;
  int local_1d4;
  char *local_1d0;
  cmsysProcess *local_1c8;
  undefined1 local_1c0 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_220 = this;
  local_218 = output;
  local_1e8 = retVal;
  local_1d4 = timeout;
  local_1d0 = dir;
  cmSystemTools::ParseArguments_abi_cxx11_(&local_48,(cmSystemTools *)command,(char *)output);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar1 = 0;
    goto LAB_00258a87;
  }
  local_208 = (char **)0x0;
  iStack_200._M_current = (char **)0x0;
  local_1f8 = (char **)0x0;
  pbVar11 = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    local_1c0._0_8_ = (pbVar11->_M_dataplus)._M_p;
    if (iStack_200._M_current == local_1f8) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_208,iStack_200,
                 (char **)local_1c0);
    }
    else {
      *iStack_200._M_current = (char *)local_1c0._0_8_;
      iStack_200._M_current = iStack_200._M_current + 1;
    }
    pbVar11 = pbVar11 + 1;
  } while (pbVar11 !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  local_1c0._0_8_ = (_func_int **)0x0;
  if (iStack_200._M_current == local_1f8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_208,iStack_200,
               (char **)local_1c0);
  }
  else {
    *iStack_200._M_current = (char *)0x0;
    iStack_200._M_current = iStack_200._M_current + 1;
  }
  std::__cxx11::string::_M_replace((ulong)local_218,0,(char *)local_218->_M_string_length,0x5e12e9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Run command:",0xc);
  std::__cxx11::stringbuf::str();
  Log(local_220,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x49c,(char *)local_240,false);
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  if (local_208 != iStack_200._M_current) {
    ppcVar9 = local_208;
    do {
      if (*ppcVar9 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," \"",2);
      pcVar6 = *ppcVar9;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)auStack_248 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18) + 0x88);
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\"",1);
      std::__cxx11::stringbuf::str();
      Log(local_220,3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4a0,(char *)local_240,false);
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
      ppcVar9 = ppcVar9 + 1;
    } while (ppcVar9 != iStack_200._M_current);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::ios::widen((char)(ostringstream *)local_1c0 + (char)*(_func_int **)(local_1c0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1c0);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_220,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x4a2,(char *)local_240,false);
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,local_208);
  cmsysProcess_SetWorkingDirectory(cp,local_1d0);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,(double)local_1d4);
  cmsysProcess_Execute(cp);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"   Each . represents ",0x15);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes of output",0x10);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_220,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x4b5,(char *)local_240,false);
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  uVar8 = 0;
  local_1c8 = cp;
  while (iVar1 = cmsysProcess_WaitForData(cp,&local_1e0,&local_20c,(double *)0x0), iVar1 != 0) {
    if (0 < local_20c) {
      lVar5 = 0;
      do {
        if (local_1e0[lVar5] == '\0') {
          local_1e0[lVar5] = '\n';
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_20c);
    }
    std::__cxx11::string::append((char *)local_218,(ulong)local_1e0);
    uVar10 = uVar8 << 10;
    if (uVar10 < local_218->_M_string_length) {
      lVar5 = -uVar8;
      do {
        uVar8 = uVar8 + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,".",1);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_220,2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
            ,0x4c3,(char *)local_240,false);
        if (local_240 != local_230) {
          operator_delete(local_240,local_230[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
        std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
        if ((lVar5 != 1) && ((uVar8 / 0x32) * -0x32 + 1 == lVar5)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"  Size: ",8);
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             ((ostringstream *)local_1c0,
                              (int)((((double)CONCAT44(0x45300000,
                                                       (int)(local_218->_M_string_length >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)local_218->_M_string_length) -
                                    4503599627370496.0)) * 0.0009765625 + 1.0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"K",1);
          std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
          std::ostream::put((char)poVar4);
          poVar4 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(local_220,2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
              ,0x4ca,(char *)local_240,false);
          if (local_240 != local_230) {
            operator_delete(local_240,local_230[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
          std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
        }
        lVar5 = lVar5 + -1;
        uVar10 = uVar10 + 0x400;
      } while (uVar10 < local_218->_M_string_length);
      uVar8 = -lVar5;
      cp = local_1c8;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    if (local_20c != 0) {
      std::ostream::write((char *)local_1c0,(long)local_1e0);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_220,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4cd,(char *)local_240,false);
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
    if ((((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) && (local_20c != 0)) {
      std::ostream::write((char *)ofs,(long)local_1e0);
      std::ostream::flush();
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," Size of output: ",0x11);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (local_1c0,
                      (int)((((double)CONCAT44(0x45300000,(int)(local_218->_M_string_length >> 0x20)
                                              ) - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_218->_M_string_length) -
                            4503599627370496.0)) * 0.0009765625));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"K",1);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_220,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x4d4,(char *)local_240,false);
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar1 = cmsysProcess_GetState(cp);
  switch(iVar1) {
  case 1:
    std::__cxx11::string::append((char *)local_218);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)local_218);
    std::__cxx11::string::append((char *)local_218);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"There was an error: ",0x14);
    pcVar6 = cmsysProcess_GetErrorString(cp);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18) + 0x88);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar6,sVar3);
    }
    std::ios::widen((char)(ostream *)local_1c0 + (char)*(_func_int **)(local_1c0._0_8_ + -0x18));
    std::ostream::put((char)local_1c0);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_220,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4f0,(char *)local_240,false);
    break;
  case 2:
    iVar2 = cmsysProcess_GetExitException(cp);
    *local_1e8 = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"There was an exception: ",0x18);
    plVar7 = (long *)std::ostream::operator<<(local_1c0,*local_1e8);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_220,4,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4e4,(char *)local_240,false);
    break;
  default:
    goto switchD_0025871f_caseD_3;
  case 4:
    iVar2 = cmsysProcess_GetExitValue(cp);
    *local_1e8 = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Command exited with the value: ",0x1f);
    plVar7 = (long *)std::ostream::operator<<(local_1c0,*local_1e8);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_220,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4de,(char *)local_240,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"There was a timeout",0x13);
    std::ios::widen((char)(ostream *)local_1c0 + (char)*(_func_int **)(local_1c0._0_8_ + -0x18));
    std::ostream::put((char)local_1c0);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_220,4,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4e8,(char *)local_240,false);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
switchD_0025871f_caseD_3:
  cmsysProcess_Delete(cp);
  if (local_208 != (char **)0x0) {
    operator_delete(local_208,(long)local_1f8 - (long)local_208);
  }
LAB_00258a87:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return iVar1;
}

Assistant:

int cmCTest::RunMakeCommand(const char* command, std::string& output,
  int* retVal, const char* dir, int timeout, std::ostream& ofs)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if(args.size() < 1)
    {
    return false;
    }

  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = args.begin();
    a != args.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);

  output = "";
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  std::vector<const char*>::iterator ait;
  for ( ait = argv.begin(); ait != argv.end() && *ait; ++ ait )
    {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << *ait << "\"");
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmCTestLog(this, HANDLER_OUTPUT,
    "   Each . represents " << tick_len << " bytes of output" << std::endl
    << "    " << std::flush);
  while(cmsysProcess_WaitForData(cp, &data, &length, 0))
    {
    for(int cc =0; cc < length; ++cc)
      {
      if(data[cc] == 0)
        {
        data[cc] = '\n';
        }
      }
    output.append(data, length);
    while ( output.size() > (tick * tick_len) )
      {
      tick ++;
      cmCTestLog(this, HANDLER_OUTPUT, "." << std::flush);
      if ( tick % tick_line_len == 0 && tick > 0 )
        {
        cmCTestLog(this, HANDLER_OUTPUT,
                   "  Size: "
                   << int((double(output.size()) / 1024.0) + 1)
                   << "K" << std::endl
                   << "    " << std::flush);
        }
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, cmCTestLogWrite(data, length));
    if ( ofs )
      {
      ofs << cmCTestLogWrite(data, length);
      }
    }
  cmCTestLog(this, OUTPUT, " Size of output: "
    << int(double(output.size()) / 1024.0) << "K" << std::endl);

  cmsysProcess_WaitForExit(cp, 0);

  int result = cmsysProcess_GetState(cp);

  if(result == cmsysProcess_State_Exited)
    {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Command exited with the value: "
      << *retVal << std::endl);
    }
  else if(result == cmsysProcess_State_Exception)
    {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING, "There was an exception: " << *retVal
      << std::endl);
    }
  else if(result == cmsysProcess_State_Expired)
    {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
    }
  else if(result == cmsysProcess_State_Error)
    {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE, "There was an error: "
      << cmsysProcess_GetErrorString(cp) << std::endl);
    }

  cmsysProcess_Delete(cp);

  return result;
}